

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O3

void ParseChassisInformation(EeePChassisInfo_t *info)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  puVar7 = &info->CElement[0].ElementType + (ulong)info->CElementSize * (ulong)info->CElementCnt;
  if (info->Manufacturer != '\0') {
    cVar4 = info->Manufacturer + 0xff;
    puVar6 = puVar7;
    if (cVar4 != '\0') {
      do {
        puVar5 = puVar6;
        sVar1 = strlen((char *)puVar5);
        puVar6 = puVar5 + sVar1 + 1;
        cVar4 = cVar4 + -1;
      } while (cVar4 != '\0');
      if (puVar5 == (uint8_t *)0x0) goto LAB_00103367;
    }
    printf("      Manufacturer: %s\n",puVar6);
  }
LAB_00103367:
  lVar2 = 8;
  pcVar3 = "";
  do {
    if (*(byte *)((long)&BoardTypeTexts[0xc].text + lVar2) == info->Type) {
      pcVar3 = *(char **)(&ChassisTypeTexts[0].code + lVar2);
      break;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x198);
  printf("      Chassis Type: %d (%s)\n",(ulong)info->Type,pcVar3);
  if (info->Version != '\0') {
    cVar4 = info->Version + 0xff;
    puVar6 = puVar7;
    if (cVar4 != '\0') {
      do {
        puVar5 = puVar6;
        sVar1 = strlen((char *)puVar5);
        puVar6 = puVar5 + sVar1 + 1;
        cVar4 = cVar4 + -1;
      } while (cVar4 != '\0');
      if (puVar5 == (uint8_t *)0x0) goto LAB_001033e3;
    }
    printf("      Version: %s\n",puVar6);
  }
LAB_001033e3:
  if (info->SerialNumber != '\0') {
    cVar4 = info->SerialNumber + 0xff;
    puVar6 = puVar7;
    if (cVar4 != '\0') {
      do {
        puVar5 = puVar6;
        sVar1 = strlen((char *)puVar5);
        puVar6 = puVar5 + sVar1 + 1;
        cVar4 = cVar4 + -1;
      } while (cVar4 != '\0');
      if (puVar5 == (uint8_t *)0x0) goto LAB_00103421;
    }
    printf("      Serial Number: %s\n",puVar6);
  }
LAB_00103421:
  if (info->AssetTagNumber != '\0') {
    cVar4 = info->AssetTagNumber + 0xff;
    if (cVar4 != '\0') {
      do {
        puVar6 = puVar7;
        sVar1 = strlen((char *)puVar6);
        puVar7 = puVar6 + sVar1 + 1;
        cVar4 = cVar4 + -1;
      } while (cVar4 != '\0');
      if (puVar6 == (uint8_t *)0x0) goto LAB_0010345b;
    }
    printf("      Asset Tag: %s\n",puVar7);
  }
LAB_0010345b:
  printf("      Height: %dU\n",(ulong)info->Height);
  printf("      Number of Power Cords: %d\n",(ulong)info->NumPowerCords);
  return;
}

Assistant:

void ParseChassisInformation(EeePChassisInfo_t *info)
{
    void *strstart = (unsigned char *)info->CElement + info->CElementCnt * info->CElementSize;
    const char *str;
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        printf("      Manufacturer: %s\n", str);
    }
    printf("      Chassis Type: %d (%s)\n",
        info->Type, FindChassisTypeText(info->Type));
    if (str = GetSmbiosString(info->Version, strstart)) {
        printf("      Version: %s\n", str);
    }
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        printf("      Serial Number: %s\n", str);
    }
    if (str = GetSmbiosString(info->AssetTagNumber, strstart)) {
        printf("      Asset Tag: %s\n", str);
    }
    printf("      Height: %dU\n", info->Height);
    printf("      Number of Power Cords: %d\n", info->NumPowerCords);
}